

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_enum_first(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  MTBDD variables_00;
  mtbddnode_t n_00;
  MTBDD MVar4;
  MTBDD res;
  mtbddnode_t n;
  uint32_t v;
  mtbdd_enum_filter_cb filter_cb_local;
  uint8_t *arr_local;
  MTBDD variables_local;
  MTBDD dd_local;
  
  if (dd == 0) {
    dd_local = 0;
  }
  else {
    iVar1 = mtbdd_isleaf(dd);
    dd_local = dd;
    if (iVar1 == 0) {
      if (variables == 0x8000000000000000) {
        if ((filter_cb != (mtbdd_enum_filter_cb)0x0) && (iVar1 = (*filter_cb)(dd), iVar1 == 0)) {
          dd_local = 0;
        }
      }
      else {
        if (variables == 0x8000000000000000) {
          __assert_fail("variables != mtbdd_true",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                        ,0x9f3,
                        "MTBDD mtbdd_enum_first(MTBDD, MTBDD, uint8_t *, mtbdd_enum_filter_cb)");
        }
        uVar2 = mtbdd_getvar(variables);
        variables_00 = mtbdd_gethigh(variables);
        n_00 = MTBDD_GETNODE(dd);
        uVar3 = mtbddnode_getvariable(n_00);
        if (uVar3 == uVar2) {
          MVar4 = mtbddnode_followlow(dd,n_00);
          dd_local = mtbdd_enum_first(MVar4,variables_00,arr + 1,filter_cb);
          if (dd_local == 0) {
            MVar4 = mtbddnode_followhigh(dd,n_00);
            dd_local = mtbdd_enum_first(MVar4,variables_00,arr + 1,filter_cb);
            if (dd_local == 0) {
              dd_local = 0;
            }
            else {
              *arr = '\x01';
            }
          }
          else {
            *arr = '\0';
          }
        }
        else {
          *arr = '\x02';
          dd_local = mtbdd_enum_first(dd,variables_00,arr + 1,filter_cb);
        }
      }
    }
    else {
      filter_cb_local = (mtbdd_enum_filter_cb)arr;
      arr_local = (uint8_t *)variables;
      if ((filter_cb == (mtbdd_enum_filter_cb)0x0) || (iVar1 = (*filter_cb)(dd), iVar1 != 0)) {
        while (arr_local != (uint8_t *)0x8000000000000000) {
          *filter_cb_local = (_func_int_MTBDD)0x2;
          arr_local = (uint8_t *)mtbdd_gethigh((MTBDD)arr_local);
          filter_cb_local = filter_cb_local + 1;
        }
      }
      else {
        dd_local = 0;
      }
    }
  }
  return dd_local;
}

Assistant:

MTBDD
mtbdd_enum_first(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (dd == mtbdd_false) {
        // the leaf dd is skipped
        return mtbdd_false;
    } else if (mtbdd_isleaf(dd)) {
        // a leaf for which the filter returns 0 is skipped
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        // ok, we have a leaf that is not skipped, go for it!
        while (variables != mtbdd_true) {
            *arr++ = 2;
            variables = mtbdd_gethigh(variables);
        }
        return dd;
    } else if (variables == mtbdd_true) {
        // in the case of partial evaluation... treat like a leaf
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        return dd;
    } else {
        // if variables == true, then dd must be a leaf. But then this line is unreachable.
        // if this assertion fails, then <variables> is not the support of <dd>.
        assert(variables != mtbdd_true);

        // get next variable from <variables>
        uint32_t v = mtbdd_getvar(variables);
        variables = mtbdd_gethigh(variables);

        // check if MTBDD is on this variable
        mtbddnode_t n = MTBDD_GETNODE(dd);
        if (mtbddnode_getvariable(n) != v) {
            *arr = 2;
            return mtbdd_enum_first(dd, variables, arr+1, filter_cb);
        }

        // first maybe follow low
        MTBDD res = mtbdd_enum_first(node_getlow(dd, n), variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 0;
            return res;
        }

        // if not low, try following high
        res = mtbdd_enum_first(node_gethigh(dd, n), variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 1;
            return res;
        }
        
        // we've tried low and high, return false
        return mtbdd_false;
    }
}